

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

undefined8
StringBuilder<char,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (char *arg,char (*args) [2],unsigned_long *args_1,char (*args_2) [2],char *args_3,
          char (*args_4) [2],unsigned_long *args_5,char (*args_6) [2],char *args_7,
          char (*args_8) [2],unsigned_long *args_9,char (*args_10) [2],char *args_11,
          char (*args_12) [2])

{
  undefined8 in_RDI;
  char (*in_R9) [2];
  unsigned_long *unaff_R12;
  char (*unaff_R13) [2];
  char *unaff_R14;
  char (*unaff_R15) [2];
  unsigned_long *unaff_retaddr;
  char (*in_stack_00000008) [2];
  char *in_stack_00000010;
  char (*in_stack_00000018) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000048;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string local_98 [32];
  char (*in_stack_ffffffffffffff88) [2];
  char *in_stack_ffffffffffffff90;
  char (*in_stack_ffffffffffffff98) [2];
  unsigned_long *in_stack_ffffffffffffffa0;
  
  StringBuilder_abi_cxx11_(in_stack_ffffffffffffff28);
  StringBuilder<char[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_R9,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88,unaff_R12,unaff_R13,unaff_R14,unaff_R15,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018);
  std::operator+(in_stack_ffffffffffffff38,in_stack_00000048);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}